

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_InsertItemInArray(cJSON *array,int which,cJSON *newitem)

{
  cJSON *pcVar1;
  cJSON *pcVar2;
  ulong uVar3;
  bool bVar4;
  
  if (which < 0) {
    return;
  }
  if (array == (cJSON *)0x0) {
    pcVar1 = (cJSON *)0x0;
  }
  else {
    uVar3 = (ulong)(uint)which;
    pcVar1 = (cJSON *)&array->child;
    do {
      pcVar1 = pcVar1->next;
      bVar4 = uVar3 != 0;
      uVar3 = uVar3 - 1;
      if (pcVar1 == (cJSON *)0x0) break;
    } while (bVar4);
  }
  if (pcVar1 == (cJSON *)0x0) {
    if (newitem == (cJSON *)0x0 || array == (cJSON *)0x0) {
      return;
    }
    pcVar1 = array->child;
    if (array->child != (cJSON *)0x0) {
      do {
        pcVar2 = pcVar1;
        pcVar1 = pcVar2->next;
      } while (pcVar2->next != (cJSON *)0x0);
      pcVar2->next = newitem;
      newitem->prev = pcVar2;
      return;
    }
  }
  else {
    newitem->next = pcVar1;
    newitem->prev = pcVar1->prev;
    pcVar1->prev = newitem;
    if (pcVar1 != array->child) {
      newitem->prev->next = newitem;
      return;
    }
  }
  array->child = newitem;
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_InsertItemInArray(cJSON *array, int which, cJSON *newitem)
{
    cJSON *after_inserted = NULL;

    if (which < 0)
    {
        return;
    }

    after_inserted = get_array_item(array, (size_t)which);
    if (after_inserted == NULL)
    {
        cJSON_AddItemToArray(array, newitem);
        return;
    }

    newitem->next = after_inserted;
    newitem->prev = after_inserted->prev;
    after_inserted->prev = newitem;
    if (after_inserted == array->child)
    {
        array->child = newitem;
    }
    else
    {
        newitem->prev->next = newitem;
    }
}